

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varenaalloc.h
# Opt level: O1

GradientStroke * __thiscall
VArenaAlloc::make<rlottie::internal::model::GradientStroke>(VArenaAlloc *this)

{
  int iVar1;
  GradientStroke *this_00;
  
  this_00 = (GradientStroke *)allocObjectWithFooter(this,200,8);
  iVar1 = *(int *)&this->fCursor;
  this->fCursor = (char *)(this_00 + 1);
  installFooter(this,make<rlottie::internal::model::GradientStroke>::anon_class_1_0_00000001::
                     __invoke,(int)this_00 - iVar1);
  rlottie::internal::model::Gradient::Gradient((Gradient *)this_00,GStroke);
  (this_00->mWidth).isValue_ = true;
  (this_00->mWidth).impl_.value_ = 0.0;
  this_00->mCapStyle = Flat;
  this_00->mJoinStyle = Miter;
  *(undefined8 *)&this_00->mMiterLimit = 0;
  *(undefined8 *)
   ((long)&(this_00->mDash).mData.
           super__Vector_base<rlottie::internal::model::Property<float,_void>,_std::allocator<rlottie::internal::model::Property<float,_void>_>_>
           ._M_impl.super__Vector_impl_data._M_start + 4) = 0;
  (this_00->mDash).mData.
  super__Vector_base<rlottie::internal::model::Property<float,_void>,_std::allocator<rlottie::internal::model::Property<float,_void>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->mDash).mData.
  super__Vector_base<rlottie::internal::model::Property<float,_void>,_std::allocator<rlottie::internal::model::Property<float,_void>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return this_00;
}

Assistant:

T* make(Args&&... args) {
        uint32_t size      = ToU32(sizeof(T));
        uint32_t alignment = ToU32(alignof(T));
        char* objStart;
        if (std::is_trivially_destructible<T>::value) {
            objStart = this->allocObject(size, alignment);
            fCursor = objStart + size;
        } else {
            objStart = this->allocObjectWithFooter(size + sizeof(Footer), alignment);
            // Can never be UB because max value is alignof(T).
            uint32_t padding = ToU32(objStart - fCursor);

            // Advance to end of object to install footer.
            fCursor = objStart + size;
            FooterAction* releaser = [](char* objEnd) {
                char* objStart = objEnd - (sizeof(T) + sizeof(Footer));
                ((T*)objStart)->~T();
                return objStart;
            };
            this->installFooter(releaser, padding);
        }

        // This must be last to make objects with nested use of this allocator work.
        return new(objStart) T(std::forward<Args>(args)...);
    }